

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * Curl_hash_add(curl_hash *h,void *key,size_t key_len,void *p)

{
  curl_llist_element *e;
  size_t sVar1;
  void *ne;
  curl_llist *pcVar2;
  curl_llist *pcVar3;
  
  pcVar3 = h->table;
  sVar1 = (*h->hash_func)(key,key_len,(long)h->slots);
  pcVar3 = pcVar3 + sVar1;
  pcVar2 = pcVar3;
  do {
    e = pcVar2->head;
    if (e == (curl_llist_element *)0x0) {
LAB_00129d15:
      ne = (*Curl_cmalloc)(key_len + 0x30);
      if (ne == (void *)0x0) {
        p = (void *)0x0;
      }
      else {
        memcpy((void *)((long)ne + 0x28),key,key_len);
        *(size_t *)((long)ne + 0x20) = key_len;
        *(void **)((long)ne + 0x18) = p;
        Curl_llist_insert_next(pcVar3,pcVar3->tail,ne,(curl_llist_element *)ne);
        h->size = h->size + 1;
      }
      return p;
    }
    sVar1 = (*h->comp_func)((void *)((long)e->ptr + 0x28),*(size_t *)((long)e->ptr + 0x20),key,
                            key_len);
    if (sVar1 != 0) {
      Curl_llist_remove(pcVar3,e,h);
      h->size = h->size - 1;
      goto LAB_00129d15;
    }
    pcVar2 = (curl_llist *)&e->next;
  } while( true );
}

Assistant:

void *
Curl_hash_add(struct curl_hash *h, void *key, size_t key_len, void *p)
{
  struct curl_hash_element  *he;
  struct curl_llist_element *le;
  struct curl_llist *l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = (struct curl_hash_element *) le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *)h);
      --h->size;
      break;
    }
  }

  he = mk_hash_element(key, key_len, p);
  if(he) {
    Curl_llist_insert_next(l, l->tail, he, &he->list);
    ++h->size;
    return p; /* return the new entry */
  }

  return NULL; /* failure */
}